

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O0

void __thiscall QMenuBarPrivate::calcActionRects(QMenuBarPrivate *this,int max_width,int start)

{
  QAction *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QMenuBar *pQVar7;
  QStyle *pQVar8;
  QRect *boundingRect;
  qsizetype qVar9;
  const_reference ppQVar10;
  ulong uVar11;
  QStyle *pQVar12;
  int *piVar13;
  reference pQVar14;
  long lVar15;
  int in_EDX;
  int in_ESI;
  QMenuBarPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar16;
  int left;
  QRect *rect;
  int i_1;
  int y;
  int x;
  int fw;
  int iWidth;
  QAction *action;
  int i;
  int icone;
  int vmargin;
  int hmargin;
  int separator_len;
  int separator_start;
  int separator;
  int itemSpacing;
  QStyle *style;
  QMenuBar *q;
  QIcon is;
  QString s;
  QSize sz;
  QFontMetrics fm;
  int max_item_height;
  QStyleOptionMenuItem opt;
  int in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  int in_stack_fffffffffffffe10;
  LayoutDirection in_stack_fffffffffffffe14;
  QRect *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  int in_stack_fffffffffffffe2c;
  QList<QRect> *pQVar17;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  int local_19c;
  int local_194;
  int local_180;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  int local_170;
  int local_16c;
  int local_168;
  undefined8 local_12c;
  undefined8 local_124;
  undefined8 local_11c;
  undefined8 local_114;
  int local_10c;
  QSize local_108;
  QSize local_100;
  QSize local_f0;
  QIcon local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  QSize local_c8;
  undefined1 *local_c0;
  int local_b4 [5];
  undefined1 local_a0 [152];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = q_func(in_RDI);
  if (((in_RDI->super_QWidgetPrivate).field_0x254 & 1) != 0) {
    pQVar17 = &in_RDI->actionRects;
    QList<QAction_*>::size(&(in_RDI->super_QWidgetPrivate).actions);
    QList<QRect>::resize
              ((QList<QRect> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (qsizetype)in_stack_fffffffffffffe18);
    QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    QList<QRect>::fill((QList<QRect> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                       ,(parameter_type)in_RDI,
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    pQVar8 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
                           );
    iVar3 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x22,0,pQVar7);
    local_b4[0] = 0;
    local_168 = -1;
    local_16c = 0;
    local_170 = 0;
    local_c0 = &DAT_aaaaaaaaaaaaaaaa;
    QWidget::fontMetrics((QWidget *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    iVar4 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x24,0,pQVar7);
    (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x23,0,pQVar7);
    (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x3e,0,pQVar7);
    local_180 = 0;
    while( true ) {
      boundingRect = (QRect *)(long)local_180;
      qVar9 = QList<QAction_*>::size(&(in_RDI->super_QWidgetPrivate).actions);
      if (qVar9 <= (long)boundingRect) break;
      ppQVar10 = QList<QAction_*>::at
                           ((QList<QAction_*> *)
                            CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                            CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      pQVar1 = *ppQVar10;
      uVar11 = QAction::isVisible();
      if ((uVar11 & 1) != 0) {
        local_c8 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        uVar11 = QAction::isSeparator();
        if ((uVar11 & 1) == 0) {
          local_e0 = &DAT_aaaaaaaaaaaaaaaa;
          local_d8 = &DAT_aaaaaaaaaaaaaaaa;
          local_d0 = &DAT_aaaaaaaaaaaaaaaa;
          QAction::text();
          local_e8.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
          QAction::icon();
          uVar11 = QIcon::isNull();
          if ((uVar11 & 1) == 0) {
            QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                         in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08);
            local_f0 = QSize::expandedTo((QSize *)in_stack_fffffffffffffe18,
                                         (QSize *)CONCAT44(in_stack_fffffffffffffe14,
                                                           in_stack_fffffffffffffe10));
            local_c8 = local_f0;
          }
          else {
            bVar2 = QString::isEmpty((QString *)0x65a397);
            if (!bVar2) {
              local_100 = (QSize)QFontMetrics::size((int)&local_c0,(QString *)0x800,(int)&local_e0,
                                                    (int *)0x0);
              local_c8 = local_100;
            }
          }
          QIcon::~QIcon(&local_e8);
          QString::~QString((QString *)0x65a3f0);
          memset(local_a0,0xaa,0x98);
          QStyleOptionMenuItem::QStyleOptionMenuItem((QStyleOptionMenuItem *)0x65a414);
          (**(code **)(*(long *)&pQVar7->super_QWidget + 0x1a0))(pQVar7,local_a0,pQVar1);
          pQVar12 = QWidget::style((QWidget *)
                                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          local_108 = (QSize)(**(code **)(*(long *)pQVar12 + 0xe8))
                                       (pQVar12,8,local_a0,&local_c8,pQVar7);
          local_c8 = local_108;
          bVar2 = QSize::isEmpty((QSize *)CONCAT44(in_stack_fffffffffffffe24,
                                                   in_stack_fffffffffffffe20));
          if (!bVar2) {
            iVar5 = QSize::width((QSize *)0x65a4a2);
            if (local_168 == -1) {
              local_16c = iVar5 + iVar3 + local_16c;
            }
            else {
              local_170 = iVar5 + iVar3 + local_170;
            }
            local_10c = QSize::height((QSize *)0x65a4ea);
            piVar13 = qMax<int>(local_b4,&local_10c);
            local_b4[0] = *piVar13;
            in_stack_fffffffffffffe2c = QSize::width((QSize *)0x65a51c);
            QSize::height((QSize *)0x65a52d);
            QRect::QRect(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                         in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                         in_stack_fffffffffffffe08);
            pQVar14 = QList<QRect>::operator[]
                                ((QList<QRect> *)
                                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            pQVar14->x1 = (Representation)(undefined4)local_11c;
            pQVar14->y1 = (Representation)local_11c._4_4_;
            pQVar14->x2 = (Representation)(undefined4)local_114;
            pQVar14->y2 = (Representation)local_114._4_4_;
          }
          QStyleOptionMenuItem::~QStyleOptionMenuItem
                    ((QStyleOptionMenuItem *)
                     CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        }
        else {
          iVar5 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x2f,0,pQVar7);
          if (iVar5 != 0) {
            local_168 = local_180;
          }
        }
      }
      local_180 = local_180 + 1;
    }
    pQVar8 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
                           );
    iVar5 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x21,0,pQVar7);
    if (in_EDX == -1) {
      in_EDX = iVar4;
    }
    local_194 = iVar5 + in_EDX + iVar3;
    local_19c = 0;
    while( true ) {
      lVar15 = (long)local_19c;
      qVar9 = QList<QAction_*>::size(&(in_RDI->super_QWidgetPrivate).actions);
      if (qVar9 <= lVar15) break;
      pQVar14 = QList<QRect>::operator[]
                          ((QList<QRect> *)
                           CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                           CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      iVar6 = (int)((ulong)lVar15 >> 0x20);
      bVar2 = QRect::isNull((QRect *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      if (!bVar2) {
        QRect::setHeight((QRect *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                         in_stack_fffffffffffffe0c);
        if ((local_168 == -1) || (local_19c < local_168)) {
          QRect::moveLeft((QRect *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                          in_stack_fffffffffffffe0c);
        }
        else {
          if ((((in_ESI - local_170) + iVar4 * -2) - iVar3) + (local_194 - local_16c) < local_16c) {
            local_194 = iVar4;
            local_16c = iVar4;
          }
          QRect::moveLeft((QRect *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                          in_stack_fffffffffffffe0c);
        }
        QRect::moveTop((QRect *)CONCAT44(in_EDX,in_stack_fffffffffffffe20),iVar6);
        iVar6 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08))
        ;
        local_194 = iVar6 + iVar3 + local_194;
        in_stack_fffffffffffffe14 = QWidget::layoutDirection((QWidget *)0x65a758);
        QWidget::rect((QWidget *)CONCAT44(in_stack_fffffffffffffe2c,iVar5));
        QVar16 = QStyle::visualRect((LayoutDirection)((ulong)pQVar17 >> 0x20),boundingRect,
                                    (QRect *)CONCAT44(in_stack_fffffffffffffe2c,iVar5));
        local_12c = QVar16._0_8_;
        pQVar14->x1 = (Representation)(undefined4)local_12c;
        pQVar14->y1 = (Representation)local_12c._4_4_;
        local_124 = QVar16._8_8_;
        pQVar14->x2 = (Representation)(undefined4)local_124;
        pQVar14->y2 = (Representation)local_124._4_4_;
      }
      local_19c = local_19c + 1;
    }
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_c0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuBarPrivate::calcActionRects(int max_width, int start) const
{
    Q_Q(const QMenuBar);

    if (!itemsDirty)
        return;

    //let's reinitialize the buffer
    actionRects.resize(actions.size());
    actionRects.fill(QRect());

    const QStyle *style = q->style();

    const int itemSpacing = style->pixelMetric(QStyle::PM_MenuBarItemSpacing, nullptr, q);
    int max_item_height = 0, separator = -1, separator_start = 0, separator_len = 0;

    //calculate size
    const QFontMetrics fm = q->fontMetrics();
    const int hmargin = style->pixelMetric(QStyle::PM_MenuBarHMargin, nullptr, q),
              vmargin = style->pixelMetric(QStyle::PM_MenuBarVMargin, nullptr, q),
                icone = style->pixelMetric(QStyle::PM_SmallIconSize, nullptr, q);
    for(int i = 0; i < actions.size(); i++) {
        QAction *action = actions.at(i);
        if (!action->isVisible())
            continue;

        QSize sz;

        //calc what I think the size is..
        if (action->isSeparator()) {
            if (style->styleHint(QStyle::SH_DrawMenuBarSeparator, nullptr, q))
                separator = i;
            continue; //we don't really position these!
        } else {
            const QString s = action->text();
            QIcon is = action->icon();
            // If an icon is set, only the icon is visible
            if (!is.isNull())
                sz = sz.expandedTo(QSize(icone, icone));
            else if (!s.isEmpty())
                sz = fm.size(Qt::TextShowMnemonic, s);
        }

        //let the style modify the above size..
        QStyleOptionMenuItem opt;
        q->initStyleOption(&opt, action);
        sz = q->style()->sizeFromContents(QStyle::CT_MenuBarItem, &opt, sz, q);

        if (!sz.isEmpty()) {
            { //update the separator state
                int iWidth = sz.width() + itemSpacing;
                if (separator == -1)
                    separator_start += iWidth;
                else
                    separator_len += iWidth;
            }
            //maximum height
            max_item_height = qMax(max_item_height, sz.height());
            //append
            actionRects[i] = QRect(0, 0, sz.width(), sz.height());
        }
    }

    //calculate position
    const int fw = q->style()->pixelMetric(QStyle::PM_MenuBarPanelWidth, nullptr, q);
    int x = fw + ((start == -1) ? hmargin : start) + itemSpacing;
    int y = fw + vmargin;
    for(int i = 0; i < actions.size(); i++) {
        QRect &rect = actionRects[i];
        if (rect.isNull())
            continue;

        //resize
        rect.setHeight(max_item_height);

        //move
        if (separator != -1 && i >= separator) { //after the separator
            int left = (max_width - separator_len - hmargin - itemSpacing) + (x - separator_start - hmargin);
            if (left < separator_start) { //wrap
                separator_start = x = hmargin;
                y += max_item_height;
            }
            rect.moveLeft(left);
        } else {
            rect.moveLeft(x);
        }
        rect.moveTop(y);

        //keep moving along..
        x += rect.width() + itemSpacing;

        //make sure we follow the layout direction
        rect = QStyle::visualRect(q->layoutDirection(), q->rect(), rect);
    }
}